

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetAttachmentParametersTest::TestDefaultFramebuffer
          (GetAttachmentParametersTest *this)

{
  ostringstream *this_00;
  GLenum GVar1;
  undefined4 uVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  MessageBuilder *pMVar6;
  GLchar **value;
  long lVar7;
  bool bVar8;
  GLint parameter_legacy;
  GLint optional_parameter_dsa;
  GLint optional_parameter_legacy;
  GLint parameter_dsa;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  long local_1d8;
  GetAttachmentParametersTest *local_1d0;
  GLchar **local_1c8;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  long lVar5;
  
  local_1d0 = this;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  bVar8 = true;
  local_1d8 = 0;
  do {
    if (local_1d8 == 6) {
      return bVar8;
    }
    local_1e8 = 0;
    local_1dc = 0;
    GVar1 = TestDefaultFramebuffer::attachments[local_1d8];
    (**(code **)(lVar5 + 0x830))(0x8d40,GVar1,0x8cd0,&local_1e8);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glGetFramebufferParameteriv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x1085);
    (**(code **)(lVar5 + 0x910))(0,GVar1,0x8cd0,&local_1dc);
    iVar3 = (**(code **)(lVar5 + 0x800))();
    if (iVar3 == 0) {
      if (local_1e8 == local_1dc) {
        if (local_1e8 != 0) {
          local_1c8 = TestDefaultFramebuffer::attachments_strings + local_1d8;
          value = TestDefaultFramebuffer::optional_pnames_strings;
          for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 4) {
            local_1e0 = 0;
            local_1e4 = 0;
            uVar2 = *(undefined4 *)((long)TestDefaultFramebuffer::optional_pnames + lVar7);
            (**(code **)(lVar5 + 0x830))(0x8d40,GVar1,uVar2,&local_1e0);
            dVar4 = (**(code **)(lVar5 + 0x800))();
            glu::checkError(dVar4,"glGetFramebufferParameteriv has failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                            ,0x10be);
            (**(code **)(lVar5 + 0x910))(0,GVar1,uVar2,&local_1e4);
            iVar3 = (**(code **)(lVar5 + 0x800))();
            if (iVar3 == 0) {
              if (local_1e0 != local_1e4) {
                local_1b0 = (undefined1  [8])
                            ((local_1d0->super_TestCase).m_context)->m_testCtx->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                std::operator<<(&local_1a8,"GetNamedFramebufferAttachmentParameteriv returned ");
                std::ostream::operator<<((ostringstream *)&local_1a8,local_1e4);
                std::operator<<(&local_1a8,", but ");
                std::ostream::operator<<((ostringstream *)&local_1a8,local_1e0);
                std::operator<<(&local_1a8," was expected for ");
                std::ostream::_M_insert<void_const*>((ostringstream *)&local_1a8);
                std::operator<<(&local_1a8," parameter name  for ");
                pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,local_1c8);
                std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                                " attachment of default framebuffer.");
                tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                goto LAB_00b00743;
              }
            }
            else {
              local_1b0 = (undefined1  [8])((local_1d0->super_TestCase).m_context)->m_testCtx->m_log
              ;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              std::operator<<(&local_1a8,
                              "GetNamedFramebufferAttachmentParameteriv unexpectedly generated ");
              local_1c0.m_getName = glu::getErrorName;
              local_1c0.m_value = iVar3;
              tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,&local_1a8);
              std::operator<<(&local_1a8," error when called with ");
              pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
              std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              " parameter name for ");
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_1c8);
              this_00 = &pMVar6->m_str;
              std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                              " attachment of default framebuffer. The GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE was "
                             );
              std::ostream::operator<<(this_00,local_1e8);
              std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,".");
              tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00b00743:
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
              bVar8 = false;
            }
            value = value + 1;
          }
        }
      }
      else {
        local_1b0 = (undefined1  [8])((local_1d0->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<(&local_1a8,"GetNamedFramebufferAttachmentParameteriv returned ");
        std::ostream::operator<<((ostringstream *)&local_1a8,local_1dc);
        std::operator<<(&local_1a8,", but ");
        std::ostream::operator<<((ostringstream *)&local_1a8,local_1e8);
        std::operator<<(&local_1a8,
                        " was expected for GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name of default framebuffer."
                       );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        bVar8 = false;
      }
    }
    else {
      local_1b0 = (undefined1  [8])((local_1d0->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,"GetNamedFramebufferAttachmentParameteriv unexpectedly generated ")
      ;
      local_1c0.m_getName = glu::getErrorName;
      local_1c0.m_value = iVar3;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,&local_1a8);
      lVar7 = local_1d8;
      std::operator<<(&local_1a8,
                      " error when called with GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name for "
                     );
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,
                          TestDefaultFramebuffer::attachments_strings + lVar7);
      std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      " attachment of default framebuffer.");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      bVar8 = false;
      local_1d8 = lVar7;
    }
    local_1d8 = local_1d8 + 1;
  } while( true );
}

Assistant:

bool GetAttachmentParametersTest::TestDefaultFramebuffer()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	static const glw::GLenum attachments[] = { GL_FRONT_LEFT, GL_FRONT_RIGHT, GL_BACK_LEFT,
											   GL_BACK_RIGHT, GL_DEPTH,		  GL_STENCIL };

	static const glw::GLchar* attachments_strings[] = { "GL_FRONT_LEFT", "GL_FRONT_RIGHT", "GL_BACK_LEFT",
														"GL_BACK_RIGHT", "GL_DEPTH",	   "GL_STENCIL" };

	static const glw::GLuint attachments_count = sizeof(attachments) / sizeof(attachments[0]);

	for (glw::GLuint j = 0; j < attachments_count; ++j)
	{
		glw::GLint parameter_legacy = 0;
		glw::GLint parameter_dsa	= 0;

		gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachments[j], GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE,
											   &parameter_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFramebufferParameteriv has failed");

		gl.getNamedFramebufferAttachmentParameteriv(0, attachments[j], GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE,
													&parameter_dsa);

		/* Error check. */
		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv unexpectedly generated "
				<< glu::getErrorStr(error)
				<< " error when called with GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name for "
				<< attachments_strings[j] << " attachment of default framebuffer." << tcu::TestLog::EndMessage;

			is_ok = false;

			continue;
		}

		if (parameter_legacy != parameter_dsa)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv returned " << parameter_dsa
				<< ", but " << parameter_legacy
				<< " was expected for GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name of default framebuffer."
				<< tcu::TestLog::EndMessage;

			is_ok = false;

			continue;
		}

		if (parameter_dsa != GL_NONE)
		{
			static const glw::GLenum optional_pnames[] = {
				GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE,		  GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE,
				GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE,	  GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE,
				GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE,	 GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE,
				GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE, GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING
			};

			static const glw::GLchar* optional_pnames_strings[] = {
				"GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE",		"GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE",
				"GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE",		"GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE",
				"GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE",		"GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE",
				"GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE", "GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING"
			};

			static const glw::GLuint optional_pnames_count = sizeof(optional_pnames) / sizeof(optional_pnames[0]);

			for (glw::GLuint i = 0; i < optional_pnames_count; ++i)
			{
				glw::GLint optional_parameter_legacy = 0;
				glw::GLint optional_parameter_dsa	= 0;

				gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachments[j], optional_pnames[i],
													   &optional_parameter_legacy);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFramebufferParameteriv has failed");

				gl.getNamedFramebufferAttachmentParameteriv(0, attachments[j], optional_pnames[i],
															&optional_parameter_dsa);

				if (glw::GLenum error = gl.getError())
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv unexpectedly generated "
						<< glu::getErrorStr(error) << " error when called with " << optional_pnames_strings[i]
						<< " parameter name for " << attachments_strings[j]
						<< " attachment of default framebuffer. The GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE was "
						<< parameter_legacy << "." << tcu::TestLog::EndMessage;

					is_ok = false;

					continue;
				}

				if (optional_parameter_legacy != optional_parameter_dsa)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv returned "
						<< optional_parameter_dsa << ", but " << optional_parameter_legacy << " was expected for "
						<< optional_pnames_strings << " parameter name  for " << attachments_strings[j]
						<< " attachment of default framebuffer." << tcu::TestLog::EndMessage;

					is_ok = false;

					continue;
				}
			}
		}
	}

	return is_ok;
}